

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# so2.hpp
# Opt level: O0

void __thiscall
Sophus::SO2Base<Sophus::SO2<float,_0>_>::normalize(SO2Base<Sophus::SO2<float,_0>_> *this)

{
  float fVar1;
  DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *pDVar2;
  CoeffReturnType pfVar3;
  DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *pDVar4;
  Scalar *pSVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  Scalar length;
  SO2Base<Sophus::SO2<float,_0>_> *this_local;
  
  pDVar2 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)unit_complex(this);
  pfVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::x(pDVar2);
  fVar6 = *pfVar3;
  pDVar2 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)unit_complex(this);
  pfVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::x(pDVar2);
  fVar7 = *pfVar3;
  pDVar2 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)unit_complex(this);
  pfVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::y(pDVar2);
  fVar1 = *pfVar3;
  pDVar2 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)unit_complex(this);
  pfVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::y(pDVar2);
  dVar8 = std::sqrt((double)(ulong)(uint)(fVar6 * fVar7 + fVar1 * *pfVar3));
  fVar6 = SUB84(dVar8,0);
  fVar7 = Constants<float>::epsilon();
  if (fVar6 < fVar7) {
    defaultEnsure<>("void Sophus::SO2Base<Sophus::SO2<float>>::normalize() [Derived = Sophus::SO2<float>]"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/powei-lin[P]OpticalFlowTracker/thirdparty/Sophus/sophus/so2.hpp"
                    ,0x8a,"Complex number should not be close to zero!");
  }
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)unit_complex_nonconst(this);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::x(pDVar4);
  *pSVar5 = *pSVar5 / fVar6;
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)unit_complex_nonconst(this);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::y(pDVar4);
  *pSVar5 = *pSVar5 / fVar6;
  return;
}

Assistant:

SOPHUS_FUNC void normalize() {
    Scalar length = std::sqrt(unit_complex().x() * unit_complex().x() +
                              unit_complex().y() * unit_complex().y());
    SOPHUS_ENSURE(length >= Constants<Scalar>::epsilon(),
                  "Complex number should not be close to zero!");
    unit_complex_nonconst().x() /= length;
    unit_complex_nonconst().y() /= length;
  }